

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O3

int Gia_GlaCountNodes(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  long lVar2;
  Gia_Obj_t *pGVar3;
  
  if ((long)p->nObjs < 1) {
LAB_0062a0ec:
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    pGVar3 = p->pObjs;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0062a0ec;
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
        if (vGla->nSize <= lVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (iVar1 + 1) - (uint)(vGla->pArray[lVar2] == 0);
      }
      lVar2 = lVar2 + 1;
      pGVar3 = pGVar3 + 1;
    } while (p->nObjs != lVar2);
  }
  return iVar1;
}

Assistant:

int Gia_GlaCountNodes( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Gia_Obj_t * pObj;
    int i, Count = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Count++;
    return Count;
}